

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_base64_decode(char *target,char *encoded,int base64_len)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  int *piVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  byte *pbVar11;
  
  if (target == (char *)0x0) {
    target = encoded;
  }
  if (base64_len < 1) {
    iVar7 = 0;
    goto LAB_0013a1fe;
  }
  uVar10 = (ulong)(uint)base64_len;
  do {
    if (base64_decodes[(byte)encoded[uVar10 - 1]] != 0) goto LAB_00139fe1;
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
  uVar10 = 0;
LAB_00139fe1:
  if ((int)uVar10 != 0) {
    ppuVar5 = __ctype_b_loc();
    pbVar8 = (byte *)(encoded + (uVar10 & 0xffffffff));
    do {
      if ((*(byte *)((long)*ppuVar5 + (ulong)(byte)*encoded * 2 + 1) & 0x20) == 0)
      goto LAB_0013a021;
      encoded = (char *)((byte *)encoded + 1);
      uVar9 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != 0);
    uVar10 = 0;
    encoded = (char *)pbVar8;
  }
LAB_0013a021:
  iVar7 = 0;
  uVar9 = (uint)uVar10;
  if (3 < (int)uVar9) {
    iVar7 = 0;
    pbVar8 = (byte *)encoded;
    do {
      encoded = (char *)(pbVar8 + 4);
      pbVar11 = (byte *)encoded;
      if ((((base64_decodes[*pbVar8] == 0) || (uVar9 = base64_decodes[pbVar8[1]], uVar9 == 0)) ||
          (uVar2 = base64_decodes[pbVar8[2]], uVar2 == 0)) ||
         (uVar3 = base64_decodes[pbVar8[3]], uVar3 == 0)) goto LAB_0013a1be;
      *target = ((byte)(uVar9 >> 4) & 3) + (char)base64_decodes[*pbVar8] * '\x04';
      ((byte *)target)[1] = (byte)(uVar2 >> 2) & 0xf | (byte)(uVar9 << 4);
      ((byte *)target)[2] = (byte)uVar3 & 0x3f | (byte)(uVar2 << 6);
      uVar9 = (int)uVar10 - 4;
      if (uVar9 != 0) {
        ppuVar5 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar5 + (long)*encoded * 2 + 1) & 0x20) == 0) goto LAB_0013a0e7;
          encoded = (char *)((byte *)encoded + 1);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        uVar9 = 0;
        encoded = (char *)(pbVar8 + (ulong)((int)uVar10 - 5) + 5);
      }
LAB_0013a0e7:
      target = (char *)((byte *)target + 3);
      iVar7 = iVar7 + 3;
      uVar10 = (ulong)uVar9;
      pbVar8 = (byte *)encoded;
    } while (3 < (int)uVar9);
  }
  if (uVar9 == 3) {
    pbVar11 = (byte *)encoded + 3;
    if (((base64_decodes[(byte)*encoded] == 0) ||
        (uVar9 = base64_decodes[((byte *)encoded)[1]], uVar9 == 0)) ||
       (uVar2 = base64_decodes[((byte *)encoded)[2]], uVar2 == 0)) {
LAB_0013a1be:
      piVar6 = __errno_location();
      *piVar6 = 0x22;
      encoded = (char *)pbVar11;
    }
    else {
      *target = (char)base64_decodes[(byte)*encoded] << 2;
      ((byte *)target)[1] = (byte)(uVar2 >> 2) & 0xf | (byte)(uVar9 << 4);
      ((byte *)target)[2] = (char)uVar2 << 6;
      target = (char *)((byte *)target + 3);
      iVar7 = iVar7 + 3;
      encoded = (char *)pbVar11;
    }
  }
  else if (uVar9 == 2) {
    pbVar11 = (byte *)encoded + 2;
    if ((base64_decodes[(byte)*encoded] == 0) ||
       (uVar9 = base64_decodes[((byte *)encoded)[1]], uVar9 == 0)) goto LAB_0013a1be;
    *target = (char)base64_decodes[(byte)*encoded] << 2;
    ((byte *)target)[1] = (char)uVar9 << 4;
    target = (char *)((byte *)target + 2);
    iVar7 = iVar7 + 2;
    encoded = (char *)pbVar11;
  }
  else if (uVar9 == 1) {
    bVar1 = *encoded;
    encoded = (char *)((byte *)encoded + 1);
    if (base64_decodes[bVar1] == 0) {
      piVar6 = __errno_location();
      *piVar6 = 0x22;
    }
    else {
      *target = (byte)base64_decodes[bVar1] & 0x3f;
      target = (char *)((byte *)target + 1);
      iVar7 = iVar7 + 1;
    }
  }
  if (((byte *)encoded)[-1] == 0x3d) {
    target = (char *)((byte *)target + ~(ulong)(((byte *)encoded)[-2] == 0x3d));
    iVar4 = ~(uint)(((byte *)encoded)[-2] == 0x3d) + iVar7;
    iVar7 = 0;
    if (0 < iVar4) {
      iVar7 = iVar4;
    }
  }
LAB_0013a1fe:
  *target = 0;
  return iVar7;
}

Assistant:

int fio_base64_decode(char *target, char *encoded, int base64_len) {
  if (!target)
    target = encoded;
  if (base64_len <= 0) {
    target[0] = 0;
    return 0;
  }
  int written = 0;
  uint8_t tmp1, tmp2, tmp3, tmp4;
  // skip unknown data at end
  while (base64_len &&
         !base64_decodes[*(uint8_t *)(encoded + (base64_len - 1))]) {
    base64_len--;
  }
  // skip white space
  while (base64_len && isspace((*(uint8_t *)encoded))) {
    base64_len--;
    encoded++;
  }
  while (base64_len >= 4) {
    if (!base64_len) {
      return written;
    }
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    tmp4 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3] || !base64_decodes[tmp4]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 4);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = (BITVAL(tmp3) << 6) | (BITVAL(tmp4));
    // make sure we don't loop forever.
    base64_len -= 4;
    // count written bytes
    written += 3;
    // skip white space
    while (base64_len && isspace((*encoded))) {
      base64_len--;
      encoded++;
    }
  }
  // deal with the "tail" of the mis-encoded stream - this shouldn't happen
  tmp1 = 0;
  tmp2 = 0;
  tmp3 = 0;
  tmp4 = 0;
  switch (base64_len) {
  case 1:
    tmp1 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = BITVAL(tmp1);
    written += 1;
    break;
  case 2:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4);
    written += 2;
    break;
  case 3:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = BITVAL(tmp3) << 6;
    written += 3;
    break;
  }
finish:
  if (encoded[-1] == '=') {
    target--;
    written--;
    if (encoded[-2] == '=') {
      target--;
      written--;
    }
    if (written < 0)
      written = 0;
  }
  *target = 0;
  return written;
}